

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.h
# Opt level: O0

void __thiscall
icu_63::ReorderingBuffer::copyReorderableSuffixTo(ReorderingBuffer *this,UnicodeString *s)

{
  char16_t *srcChars;
  ConstChar16Ptr local_20;
  UnicodeString *local_18;
  UnicodeString *s_local;
  ReorderingBuffer *this_local;
  
  local_18 = s;
  s_local = (UnicodeString *)this;
  ConstChar16Ptr::ConstChar16Ptr(&local_20,this->reorderStart);
  srcChars = ConstChar16Ptr::operator_cast_to_char16_t_(&local_20);
  UnicodeString::setTo
            (s,srcChars,(int32_t)((ulong)((long)this->limit - (long)this->reorderStart) >> 1));
  ConstChar16Ptr::~ConstChar16Ptr(&local_20);
  return;
}

Assistant:

void copyReorderableSuffixTo(UnicodeString &s) const {
        s.setTo(ConstChar16Ptr(reorderStart), (int32_t)(limit-reorderStart));
    }